

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  undefined8 in_RAX;
  ostream *poVar1;
  int i_1;
  long lVar2;
  int j;
  long lVar3;
  int i;
  long lVar4;
  int n;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  __isoc99_scanf("%d",(long)&uStack_38 + 4);
  lVar3 = 0x104090;
  for (lVar4 = 0; lVar4 < uStack_38._4_4_; lVar4 = lVar4 + 1) {
    __isoc99_scanf("%s",stu + lVar4);
    for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
      __isoc99_scanf("%d",lVar3 + lVar2);
    }
    lVar3 = lVar3 + 0x20;
  }
  std::__sort<Student*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Student,Student)>>
            (stu,stu + 5,(_Iter_comp_iter<bool_(*)(Student,_Student)>)0x1011bc);
  lVar4 = 0x104090;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,stu[lVar3].name);
    std::operator<<(poVar1," ");
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      poVar1 = (ostream *)
               std::ostream::operator<<((ostream *)&std::cout,*(int *)(lVar4 + lVar2 * 4));
      std::operator<<(poVar1," ");
    }
    std::operator<<((ostream *)&std::cout,"\n");
    lVar4 = lVar4 + 0x20;
  }
  return 0;
}

Assistant:

int main() {
    int n;
    scanf("%d",&n);
    for (int i = 0; i < n; ++i) {
    scanf("%s",&stu[i].name);
        for (int j = 0; j < 4; ++j) {
            scanf("%d", &stu[i].socre[j]);
        }
    }
    sort(stu,stu+(4+1),cmp);    //尾地址要往后面走一位,因为地址0-4，一共有5个，所有尾地址填 5。
    for (int i = 0; i < 4; ++i) {
        cout << stu[i].name << " ";
        for (int j = 0; j < 4; ++j) {
            cout << stu[i].socre[j] << " ";
        }
        cout << "\n";
    }
    return 0;
}